

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_bind_pointer
              (sqlite3_stmt *pStmt,int i,void *pPtr,char *zPTtype,_func_void_void_ptr *xDestructor)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  code *pcVar4;
  
  iVar2 = vdbeUnbind((Vdbe *)pStmt,i);
  if (iVar2 == 0) {
    lVar1 = *(long *)(pStmt + 0x80) + (long)i * 0x38;
    vdbeMemClear((Mem *)(lVar1 + -0x38));
    pcVar3 = "";
    if (zPTtype != (char *)0x0) {
      pcVar3 = zPTtype;
    }
    (((Mem *)(lVar1 + -0x38))->u).zPType = pcVar3;
    *(void **)(lVar1 + -0x30) = pPtr;
    *(undefined2 *)(lVar1 + -0x24) = 0x1a01;
    *(undefined1 *)(lVar1 + -0x21) = 0x70;
    pcVar4 = sqlite3NoopDestructor;
    if (xDestructor != (_func_void_void_ptr *)0x0) {
      pcVar4 = xDestructor;
    }
    *(code **)(lVar1 + -8) = pcVar4;
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  else if (xDestructor != (_func_void_void_ptr *)0x0) {
    (*xDestructor)(pPtr);
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_bind_pointer(
  sqlite3_stmt *pStmt,
  int i,
  void *pPtr,
  const char *zPTtype,
  void (*xDestructor)(void*)
){
  int rc;
  Vdbe *p = (Vdbe*)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetPointer(&p->aVar[i-1], pPtr, zPTtype, xDestructor);
    sqlite3_mutex_leave(p->db->mutex);
  }else if( xDestructor ){
    xDestructor(pPtr);
  }
  return rc;
}